

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_1::FrontFacingFragmentShader::shadeFragments
          (FrontFacingFragmentShader *this,FragmentPacket *param_1,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  
  if (0 < numPackets) {
    dVar7 = 0;
    if (context->visibleFace == FACETYPE_FRONT) {
      dVar8 = 0;
      dVar7 = 0x3f800000;
    }
    else {
      dVar8 = 0x3f800000;
    }
    pGVar2 = context->outputArray;
    iVar1 = context->numFragmentOutputs;
    iVar3 = 0;
    uVar4 = 0;
    do {
      lVar5 = 4;
      iVar6 = iVar3;
      do {
        pGVar2[iVar6].v.uData[0] = dVar7;
        pGVar2[iVar6].v.uData[1] = dVar8;
        *(undefined8 *)((long)&pGVar2[iVar6].v + 8) = 0x3f80000000000000;
        iVar6 = iVar6 + iVar1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + iVar1 * 4;
    } while (uVar4 != (uint)numPackets);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* , const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec4 color;
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; ++fragNdx)
			{
				if (context.visibleFace == rr::FACETYPE_FRONT)
					color = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
				else
					color = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			}
		}
	}